

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::FixNewlines::expandNearParens
          (FixNewlines *this,ArgParams *params,Fodder *fodder_r)

{
  bool bVar1;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *in_RSI;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *in_RDI;
  Fodder *in_stack_00000030;
  FixNewlines *in_stack_ffffffffffffffd8;
  
  bVar1 = std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
          empty(in_RSI);
  if (!bVar1) {
    std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::front
              (in_RDI);
    argParamOpenFodder(in_stack_ffffffffffffffd8,(ArgParam *)0x2c3842);
    ensureCleanNewline(in_stack_00000030);
  }
  ensureCleanNewline(in_stack_00000030);
  return;
}

Assistant:

void expandNearParens(ArgParams &params, Fodder &fodder_r)
    {
        if (!params.empty()) {
            ensureCleanNewline(argParamOpenFodder(params.front()));
        }
        ensureCleanNewline(fodder_r);
    }